

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt32emu-smf2wav.cpp
# Opt level: O3

void putSampleLE(void *sampleBuffer,int sampleIx,FILE *outputFile,
                OUTPUT_SAMPLE_FORMAT outputSampleFormat)

{
  ushort uVar1;
  uint uVar2;
  float fVar3;
  double dVar4;
  int local_1c;
  
  if (outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
    fVar3 = *(float *)((long)sampleBuffer + (long)sampleIx * 4);
    uVar2 = 0;
    if ((fVar3 != 0.0) && (dVar4 = (double)fVar3, uVar2 = 0, ABS(dVar4) <= 3.4028234663852886e+38))
    {
      dVar4 = frexp(dVar4,&local_1c);
      fVar3 = ABS((float)dVar4);
      uVar2 = 0;
      if (local_1c + 0x7dU < 0xfe && 0.5 <= fVar3) {
        uVar2 = ((int)(fVar3 * 16777216.0) & 0x7fffffU) +
                local_1c * 0x800000 + (uint)((float)dVar4 < 0.0) * -0x80000000 + 0x3f000000;
      }
    }
    fputc(uVar2 & 0xff,(FILE *)outputFile);
    fputc(uVar2 >> 8 & 0xff,(FILE *)outputFile);
    fputc(uVar2 >> 0x10 & 0xff,(FILE *)outputFile);
    uVar2 = uVar2 >> 0x18;
  }
  else {
    uVar1 = *(ushort *)((long)sampleBuffer + (long)sampleIx * 2);
    fputc((uint)(byte)uVar1,(FILE *)outputFile);
    uVar2 = (uint)(uVar1 >> 8);
  }
  fputc(uVar2,(FILE *)outputFile);
  return;
}

Assistant:

static inline void putSampleLE(void * const sampleBuffer, const int sampleIx, FILE *outputFile, const OUTPUT_SAMPLE_FORMAT outputSampleFormat) {
	if (outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
		MT32Emu::Bit32u sample = makeIeeeFloat(static_cast<float *>(sampleBuffer)[sampleIx]);
		fputc(sample & 0xFF, outputFile);
		fputc((sample >> 8) & 0xFF, outputFile);
		fputc((sample >> 16) & 0xFF, outputFile);
		fputc((sample >> 24) & 0xFF, outputFile);
	} else {
		MT32Emu::Bit16s sample = static_cast<MT32Emu::Bit16s *>(sampleBuffer)[sampleIx];
		fputc(sample & 0xFF, outputFile);
		fputc((sample >> 8) & 0xFF, outputFile);
	}
}